

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O0

gs_val_t *
gs_c_fn_terrain_model_add_water_face
          (gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  float fVar1;
  golf_string_t *pgVar2;
  vec_gs_val_t *pvVar3;
  vec_gs_val_t *pvVar4;
  vec_int_t idx_00;
  golf_geo_face_t face_00;
  vec_vec2_t uvs_00;
  vec3 water_dir_00;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [24];
  undefined1 auVar15 [24];
  undefined1 in_stack_fffffffffffffe08 [96];
  gs_val_t *__return_storage_ptr___00;
  undefined1 local_178 [8];
  golf_geo_face_t face;
  gs_val_t uv_val;
  gs_val_t idx_val;
  char *pcStack_b0;
  int i;
  vec_vec2_t uvs;
  vec_int_t idx;
  vec3 water_dir;
  vec_gs_val_t *uvs_list;
  vec_gs_val_t *idx_list;
  golf_string_t *material_string;
  gs_val_t sig;
  gs_val_type gStack_38;
  int signature_arg_count;
  gs_val_type signature_arg_types [4];
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  bVar9 = 0;
  _gStack_38 = 0x600000007;
  signature_arg_types[0] = GS_VAL_LIST;
  signature_arg_types[1] = GS_VAL_VEC3;
  sig.field_2._12_4_ = 4;
  __return_storage_ptr___00 = __return_storage_ptr__;
  gs_c_fn_signature((gs_val_t *)&material_string,eval,vals,num_vals,&gStack_38,4);
  if ((material_string._4_4_ & 1) == 0) {
    pgVar2 = (vals->field_2).string_val;
    pvVar3 = vals[1].field_2.list_val;
    pvVar4 = vals[2].field_2.list_val;
    unique0x00012000 = vals[3].field_2.list_val;
    fVar1 = vals[3].field_2.vec3_val.z;
    if (pvVar3->length == pvVar4->length) {
      memset(&uvs.alloc_category,0,0x18);
      idx._8_8_ = anon_var_dwarf_6c29;
      memset(&stack0xffffffffffffff50,0,0x18);
      uvs._8_8_ = anon_var_dwarf_6c29;
      for (idx_val.field_2._12_4_ = 0; (int)idx_val.field_2._12_4_ < pvVar3->length;
          idx_val.field_2._12_4_ = idx_val.field_2._12_4_ + 1) {
        gs_eval_cast((gs_val_t *)((long)&uv_val.field_2 + 8),eval,
                     pvVar3->data[(int)idx_val.field_2._12_4_],GS_VAL_INT);
        if ((uv_val.field_2.field10[0xc] & 1) != 0) {
          gs_val_error(__return_storage_ptr___00,"Expected an int in idx list");
          return __return_storage_ptr__;
        }
        gs_eval_cast((gs_val_t *)&face.water_dir.y,eval,pvVar4->data[(int)idx_val.field_2._12_4_],
                     GS_VAL_VEC2);
        if ((face.water_dir.z._0_1_ & 1) != 0) {
          gs_val_error(__return_storage_ptr___00,"Expected a vec2 in uv list");
          return __return_storage_ptr__;
        }
        iVar5 = vec_expand_(&uvs.alloc_category,(int *)&idx,(int *)((long)&idx.data + 4),4,
                            (char *)idx._8_8_);
        if (iVar5 == 0) {
          *(gs_val_type *)(uvs.alloc_category + (long)(int)idx.data * 4) = idx_val.type;
          idx.data._0_4_ = (int)idx.data + 1;
        }
        iVar5 = vec_expand_(&stack0xffffffffffffff50,(int *)&uvs,(int *)((long)&uvs.data + 4),8,
                            (char *)uvs._8_8_);
        if (iVar5 == 0) {
          *(undefined8 *)(pcStack_b0 + (long)(int)uvs.data * 8) = uv_val._0_8_;
          uvs.data._0_4_ = (int)uvs.data + 1;
        }
      }
      water_dir_00.z = fVar1;
      water_dir_00._0_8_ = stack0xffffffffffffff84;
      uVar12 = CONCAT44(uvs.data._4_4_,(int)uvs.data);
      uVar10 = CONCAT44(idx.data._4_4_,(int)idx.data);
      idx_00.length = (int)idx.data;
      idx_00.capacity = idx.data._4_4_;
      idx_00.data = (int *)uvs.alloc_category;
      idx_00.alloc_category = (char *)idx._8_8_;
      uvs_00.length = (int)uvs.data;
      uvs_00.capacity = uvs.data._4_4_;
      uvs_00.data = (vec2 *)pcStack_b0;
      uvs_00.alloc_category = (char *)uvs._8_8_;
      uVar11 = idx._8_8_;
      uVar13 = uvs._8_8_;
      golf_geo_face((golf_geo_face_t *)local_178,pgVar2->cstr,idx_00,GOLF_GEO_FACE_UV_GEN_MANUAL,
                    uvs_00,water_dir_00);
      puVar7 = (undefined8 *)local_178;
      puVar8 = (undefined8 *)&stack0xfffffffffffffdd8;
      for (lVar6 = 0x12; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      face_00.material_name._7_8_ = uVar11;
      face_00.active = (_Bool)(char)uVar10;
      face_00.material_name[0] = (char)((ulong)uVar10 >> 8);
      face_00.material_name[1] = (char)((ulong)uVar10 >> 0x10);
      face_00.material_name[2] = (char)((ulong)uVar10 >> 0x18);
      face_00.material_name[3] = (char)((ulong)uVar10 >> 0x20);
      face_00.material_name[4] = (char)((ulong)uVar10 >> 0x28);
      face_00.material_name[5] = (char)((ulong)uVar10 >> 0x30);
      face_00.material_name[6] = (char)((ulong)uVar10 >> 0x38);
      face_00.material_name._15_8_ = pcStack_b0;
      face_00.material_name[0x17] = (char)uVar12;
      face_00.material_name[0x18] = (char)((ulong)uVar12 >> 8);
      face_00.material_name[0x19] = (char)((ulong)uVar12 >> 0x10);
      face_00.material_name[0x1a] = (char)((ulong)uVar12 >> 0x18);
      face_00.material_name[0x1b] = (char)((ulong)uVar12 >> 0x20);
      face_00.material_name[0x1c] = (char)((ulong)uVar12 >> 0x28);
      face_00.material_name[0x1d] = (char)((ulong)uVar12 >> 0x30);
      face_00.material_name[0x1e] = (char)((ulong)uVar12 >> 0x38);
      face_00.material_name._31_8_ = uVar13;
      auVar14 = in_stack_fffffffffffffe08._32_24_;
      auVar15 = in_stack_fffffffffffffe08._64_24_;
      face_00.material_name[0x27] = in_stack_fffffffffffffe08[0];
      face_00.material_name[0x28] = in_stack_fffffffffffffe08[1];
      face_00.material_name[0x29] = in_stack_fffffffffffffe08[2];
      face_00.material_name[0x2a] = in_stack_fffffffffffffe08[3];
      face_00.material_name[0x2b] = in_stack_fffffffffffffe08[4];
      face_00.material_name[0x2c] = in_stack_fffffffffffffe08[5];
      face_00.material_name[0x2d] = in_stack_fffffffffffffe08[6];
      face_00.material_name[0x2e] = in_stack_fffffffffffffe08[7];
      face_00.material_name[0x2f] = in_stack_fffffffffffffe08[8];
      face_00.material_name[0x30] = in_stack_fffffffffffffe08[9];
      face_00.material_name[0x31] = in_stack_fffffffffffffe08[10];
      face_00.material_name[0x32] = in_stack_fffffffffffffe08[0xb];
      face_00.material_name[0x33] = in_stack_fffffffffffffe08[0xc];
      face_00.material_name[0x34] = in_stack_fffffffffffffe08[0xd];
      face_00.material_name[0x35] = in_stack_fffffffffffffe08[0xe];
      face_00.material_name[0x36] = in_stack_fffffffffffffe08[0xf];
      face_00.material_name[0x37] = in_stack_fffffffffffffe08[0x10];
      face_00.material_name[0x38] = in_stack_fffffffffffffe08[0x11];
      face_00.material_name[0x39] = in_stack_fffffffffffffe08[0x12];
      face_00.material_name[0x3a] = in_stack_fffffffffffffe08[0x13];
      face_00.material_name[0x3b] = in_stack_fffffffffffffe08[0x14];
      face_00.material_name[0x3c] = in_stack_fffffffffffffe08[0x15];
      face_00.material_name[0x3d] = in_stack_fffffffffffffe08[0x16];
      face_00.material_name[0x3e] = in_stack_fffffffffffffe08[0x17];
      face_00.material_name[0x3f] = in_stack_fffffffffffffe08[0x18];
      face_00._65_7_ = in_stack_fffffffffffffe08._25_7_;
      face_00.idx.data = (int *)auVar14._0_8_;
      face_00.idx.length = auVar14._8_4_;
      face_00.idx.capacity = auVar14._12_4_;
      face_00.idx.alloc_category = (char *)auVar14._16_8_;
      face_00.uv_gen_type = in_stack_fffffffffffffe08._56_4_;
      face_00._100_4_ = in_stack_fffffffffffffe08._60_4_;
      face_00.uvs.data = (vec2 *)auVar15._0_8_;
      face_00.uvs.length = auVar15._8_4_;
      face_00.uvs.capacity = auVar15._12_4_;
      face_00.uvs.alloc_category = (char *)auVar15._16_8_;
      face_00.start_vertex_in_model = in_stack_fffffffffffffe08._88_4_;
      face_00.water_dir.x = (float)in_stack_fffffffffffffe08._92_4_;
      face_00.water_dir._4_8_ = __return_storage_ptr___00;
      golf_editor_edit_mode_geo_add_face(face_00);
      gs_val_void();
    }
    else {
      gs_val_error(__return_storage_ptr___00,"Need same number of idx and uvs");
    }
  }
  else {
    __return_storage_ptr___00->type = material_string._0_4_;
    __return_storage_ptr___00->is_return = (_Bool)(char)material_string._4_4_;
    *(int3 *)&__return_storage_ptr___00->field_0x5 = (int3)(material_string._4_4_ >> 8);
    (__return_storage_ptr___00->field_2).vec2_val = (vec2)sig._0_8_;
    *(vec2 *)((long)&__return_storage_ptr___00->field_2 + 8) = sig.field_2.vec2_val;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_terrain_model_add_water_face(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_STRING, GS_VAL_LIST, GS_VAL_LIST, GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    golf_string_t *material_string = vals[0].string_val;
    vec_gs_val_t *idx_list = vals[1].list_val;
    vec_gs_val_t *uvs_list = vals[2].list_val;
    vec3 water_dir = vals[3].vec3_val;

    if (idx_list->length != uvs_list->length) {
        return gs_val_error("Need same number of idx and uvs");
    }
    
    vec_int_t idx;
    vec_init(&idx, "geo");

    vec_vec2_t uvs;
    vec_init(&uvs, "geo");

    for (int i = 0; i < idx_list->length; i++) {
        gs_val_t idx_val = gs_eval_cast(eval, idx_list->data[i], GS_VAL_INT);
        if (idx_val.is_return) {
            return gs_val_error("Expected an int in idx list");
        }

        gs_val_t uv_val = gs_eval_cast(eval, uvs_list->data[i], GS_VAL_VEC2);
        if (uv_val.is_return) {
            return gs_val_error("Expected a vec2 in uv list");
        }

        vec_push(&idx, idx_val.int_val);
        vec_push(&uvs, uv_val.vec2_val);
    }

    golf_geo_face_t face = golf_geo_face(material_string->cstr, idx, GOLF_GEO_FACE_UV_GEN_MANUAL, uvs, water_dir);
    golf_editor_edit_mode_geo_add_face(face);

    return gs_val_void();
}